

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintString
          (FieldValuePrinterWrapper *this,string *val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  undefined8 in_RSI;
  string *in_stack_ffffffffffffffb8;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  string local_38 [40];
  undefined8 local_10;
  
  local_10 = in_RSI;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x438b4a);
  (*pFVar1->_vptr_FieldValuePrinter[9])(local_38,pFVar1,local_10);
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrintString(const std::string& val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintString(val));
  }